

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O3

CPAccessResult access_predinv(CPUARMState_conflict *env,ARMCPRegInfo_conflict *ri,_Bool isread)

{
  ulong uVar1;
  uint uVar2;
  ARMMMUIdx AVar3;
  uint64_t uVar4;
  
  uVar1 = env->features;
  if (((uint)uVar1 >> 9 & 1) == 0) {
    if (env->aarch64 == 0) {
      uVar2 = env->uncached_cpsr & 0x1f;
      if (uVar2 != 0x10) {
        if (uVar2 == 0x16) {
          return CP_ACCESS_OK;
        }
        if (uVar2 == 0x1a) {
          return CP_ACCESS_OK;
        }
        if ((uVar1 >> 0x21 & 1) != 0) {
          if (uVar2 == 0x16) {
            if (((uint)uVar1 >> 0x1c & 1) == 0) {
              return CP_ACCESS_OK;
            }
          }
          else if ((uVar1 & 0x10000000) == 0 && ((env->cp15).scr_el3 & 1) == 0) {
            return CP_ACCESS_OK;
          }
        }
        goto LAB_0061d895;
      }
    }
    else {
      uVar2 = env->pstate >> 2 & 3;
LAB_0061d827:
      if (uVar2 == 1) goto LAB_0061d895;
      if (uVar2 != 0) {
        return CP_ACCESS_OK;
      }
    }
    AVar3 = arm_mmu_idx_el_aarch64(env,0);
    if ((*(byte *)((long)(env->cp15).cptr_el + (ulong)(AVar3 == ARMMMUIdx_E20_0) * 8 + -0x1f) & 4)
        == 0) {
      return CP_ACCESS_TRAP;
    }
  }
  else {
    if ((env->v7m).exception == 0) {
      uVar2 = ~(env->v7m).control[(env->v7m).secure] & 1;
      goto LAB_0061d827;
    }
LAB_0061d895:
    uVar4 = arm_hcr_el2_eff_aarch64(env);
    if ((uVar4 >> 0x2a & 1) != 0) {
      return CP_ACCESS_TRAP_EL2;
    }
  }
  return CP_ACCESS_OK;
}

Assistant:

static CPAccessResult access_predinv(CPUARMState *env, const ARMCPRegInfo *ri,
                                     bool isread)
{
    int el = arm_current_el(env);

    if (el == 0) {
        uint64_t sctlr = arm_sctlr(env, el);
        if (!(sctlr & SCTLR_EnRCTX)) {
            return CP_ACCESS_TRAP;
        }
    } else if (el == 1) {
        uint64_t hcr = arm_hcr_el2_eff(env);
        if (hcr & HCR_NV) {
            return CP_ACCESS_TRAP_EL2;
        }
    }
    return CP_ACCESS_OK;
}